

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O3

void __thiscall duckdb::ChecksumWriter::Flush(ChecksumWriter *this)

{
  optional_ptr<duckdb::WriteStream,_true> *this_00;
  MemoryStream *this_01;
  WriteStream *pWVar1;
  BufferedFileWriter *pBVar2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  uint64_t uVar5;
  idx_t local_38;
  
  this_00 = &this->stream;
  if ((this->stream).ptr == (WriteStream *)0x0) {
    pBVar2 = WriteAheadLog::Initialize(this->wal);
    (this->stream).ptr = &pBVar2->super_WriteStream;
  }
  this_01 = &this->memory_stream;
  pdVar3 = MemoryStream::GetData(this_01);
  iVar4 = MemoryStream::GetPosition(this_01);
  uVar5 = Checksum(pdVar3,iVar4);
  optional_ptr<duckdb::WriteStream,_true>::CheckValid(this_00);
  pWVar1 = (this->stream).ptr;
  local_38 = iVar4;
  (**pWVar1->_vptr_WriteStream)(pWVar1,&local_38,8);
  optional_ptr<duckdb::WriteStream,_true>::CheckValid(this_00);
  pWVar1 = (this->stream).ptr;
  local_38 = uVar5;
  (**pWVar1->_vptr_WriteStream)(pWVar1,&local_38,8);
  optional_ptr<duckdb::WriteStream,_true>::CheckValid(this_00);
  pWVar1 = (this->stream).ptr;
  pdVar3 = MemoryStream::GetData(this_01);
  iVar4 = MemoryStream::GetPosition(this_01);
  (**pWVar1->_vptr_WriteStream)(pWVar1,pdVar3,iVar4);
  MemoryStream::Rewind(this_01);
  return;
}

Assistant:

void Flush() {
		if (!stream) {
			stream = wal.Initialize();
		}
		auto data = memory_stream.GetData();
		auto size = memory_stream.GetPosition();
		// compute the checksum over the entry
		auto checksum = Checksum(data, size);
		// write the checksum and the length of the entry
		stream->Write<uint64_t>(size);
		stream->Write<uint64_t>(checksum);
		// write data to the underlying stream
		stream->WriteData(memory_stream.GetData(), memory_stream.GetPosition());
		// rewind the buffer
		memory_stream.Rewind();
	}